

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall pybind11::error_already_set::~error_already_set(error_already_set *this)

{
  error_already_set *this_local;
  
  ~error_already_set(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

error_already_set::~error_already_set() {
    if (m_type) {
        gil_scoped_acquire gil;
        error_scope scope;
        m_type.release().dec_ref();
        m_value.release().dec_ref();
        m_trace.release().dec_ref();
    }
}